

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O3

void workspace_hide(natwm_state *state,workspace *workspace)

{
  client *client;
  node *pnVar1;
  
  if (workspace->is_visible == true) {
    workspace->is_visible = false;
    workspace->is_focused = false;
    for (pnVar1 = workspace->clients->head; pnVar1 != (node *)0x0; pnVar1 = pnVar1->next) {
      client = (client *)pnVar1->data;
      if ((client != (client *)0x0) && ((client->state & CLIENT_HIDDEN) == 0)) {
        client_hide(state,client);
      }
    }
  }
  return;
}

Assistant:

static void workspace_hide(const struct natwm_state *state, struct workspace *workspace)
{
        if (!workspace->is_visible) {
                return;
        }

        workspace->is_focused = false;
        workspace->is_visible = false;

        LIST_FOR_EACH(workspace->clients, node)
        {
                struct client *client = get_client_from_client_node(node);

                if (client == NULL || client->state & CLIENT_HIDDEN) {
                        continue;
                }

                client_hide(state, client);
        }
}